

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O1

DdNode ** Extra_bddSpaceExorGates(DdManager *dd,DdNode *bFuncRed,DdNode *zEquations)

{
  int *support;
  DdNode **__s;
  DdNode *n;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  ulong uVar6;
  size_t __size;
  
  iVar3 = dd->size;
  if (dd->size < dd->sizeZ) {
    iVar3 = dd->sizeZ;
  }
  support = (int *)malloc((long)iVar3 << 2);
  Extra_SupportArray(dd,bFuncRed,support);
  __size = (long)dd->size << 3;
  __s = (DdNode **)malloc(__size);
  memset(__s,0,__size);
  Cudd_Ref(zEquations);
  pDVar5 = zEquations;
  if (dd->zero != zEquations) {
    do {
      n = Extra_zddSelectOneSubset(dd,pDVar5);
      Cudd_Ref(n);
      zEquations = Cudd_zddDiff(dd,pDVar5,n);
      Cudd_Ref(zEquations);
      Cudd_RecursiveDerefZdd(dd,pDVar5);
      pDVar5 = dd->one;
      if (n == pDVar5) {
        uVar1 = 0xffffffff;
      }
      else {
        uVar6 = 0xffffffff;
        pDVar4 = n;
        do {
          uVar2 = (ulong)(pDVar4->index >> 1);
          iVar3 = (int)uVar6;
          if ((support[uVar2] == 1) && (uVar6 = uVar2, iVar3 != -1)) {
            __assert_fail("iVarNonCan == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddAuto.c"
                          ,0x211,"DdNode **Extra_bddSpaceExorGates(DdManager *, DdNode *, DdNode *)"
                         );
          }
          pDVar4 = (pDVar4->type).kids.T;
          uVar1 = (uint)uVar6;
        } while (pDVar4 != pDVar5);
      }
      if (uVar1 == 0xffffffff) {
        __assert_fail("iVarNonCan != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddAuto.c"
                      ,0x215,"DdNode **Extra_bddSpaceExorGates(DdManager *, DdNode *, DdNode *)");
      }
      if ((pDVar5 == n) || (dd->zero == n)) {
LAB_007aae46:
        Cudd_RecursiveDerefZdd(dd,n);
      }
      else {
        iVar3 = 1;
        pDVar4 = n;
        do {
          pDVar4 = (pDVar4->type).kids.T;
          iVar3 = iVar3 + -1;
        } while (pDVar4 != pDVar5);
        if (iVar3 == 0) goto LAB_007aae46;
        __s[uVar1] = n;
      }
      pDVar5 = zEquations;
    } while (zEquations != dd->zero);
  }
  Cudd_RecursiveDerefZdd(dd,zEquations);
  if (support != (int *)0x0) {
    free(support);
  }
  return __s;
}

Assistant:

DdNode ** Extra_bddSpaceExorGates( DdManager * dd, DdNode * bFuncRed, DdNode * zEquations )
{
	DdNode ** pzRes;
	int * pVarsNonCan;
	DdNode * zEquRem;
	int iVarNonCan;
	DdNode * zExor, * zTemp;

	// get the set of non-canonical variables
	pVarsNonCan = ABC_ALLOC( int, ddMax(dd->size,dd->sizeZ) );
	Extra_SupportArray( dd, bFuncRed, pVarsNonCan );

	// allocate storage for the EXOR sets
	pzRes = ABC_ALLOC( DdNode *, dd->size );
	memset( pzRes, 0, sizeof(DdNode *) * dd->size );

	// go through all the equations
	zEquRem = zEquations;  Cudd_Ref( zEquRem );
	while ( zEquRem != z0 )
	{
		// extract one product
		zExor = Extra_zddSelectOneSubset( dd, zEquRem );   Cudd_Ref( zExor );
		// remove it from the set
		zEquRem = Cudd_zddDiff( dd, zTemp = zEquRem, zExor );  Cudd_Ref( zEquRem );
		Cudd_RecursiveDerefZdd( dd, zTemp );

		// locate the non-canonical variable
		iVarNonCan = -1;
		for ( zTemp = zExor; zTemp != z1; zTemp = cuddT(zTemp) )
		{
			if ( pVarsNonCan[zTemp->index/2] == 1 )
			{
				assert( iVarNonCan == -1 );
				iVarNonCan = zTemp->index/2;
			}
		}
		assert( iVarNonCan != -1 );

		if ( Extra_zddLitCountComb( dd, zExor ) > 1 )
			pzRes[ iVarNonCan ] = zExor; // takes ref
		else
			Cudd_RecursiveDerefZdd( dd, zExor );
	}
	Cudd_RecursiveDerefZdd( dd, zEquRem );

	ABC_FREE( pVarsNonCan );
	return pzRes;
}